

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_row_access.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
::erase_empty_row(Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
                  *this,uint rowIndex)

{
  bool bVar1;
  pointer ppVar2;
  bool local_39;
  _Self local_28;
  _Self local_20;
  iterator it;
  uint rowIndex_local;
  Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
  *this_local;
  
  it._M_node._4_4_ = rowIndex;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
       ::find(this->rows_,(key_type *)((long)&it._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
       ::end(this->rows_);
  bVar1 = std::operator!=(&local_20,&local_28);
  local_39 = false;
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
             ::operator->(&local_20);
    local_39 = boost::intrusive::
               list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
               ::empty(&(ppVar2->second).super_type);
  }
  if (local_39 != false) {
    std::
    map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
    ::erase_abi_cxx11_((map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
                        *)this->rows_,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void erase_empty_row(ID_index rowIndex) {
    static_assert(has_removable_rows, "'erase_empty_row' is not implemented for the chosen options.");

    auto it = rows_->find(rowIndex);
    if (it != rows_->end() && it->second.empty()) rows_->erase(it);
  }